

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 floatx80_to_float64_tricore(floatx80 a,float_status *status)

{
  float64 fVar1;
  ushort uVar2;
  int zExp;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar3 = a.low;
  uVar2 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar3)
  {
    status->float_exception_flags = status->float_exception_flags | 1;
    return 0x7ff8000000000000;
  }
  uVar6 = (a._8_8_ & 0xffff) >> 0xf;
  if (uVar2 != 0x7fff) {
    iVar5 = uVar2 - 0x3c01;
    zExp = 0;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
      zExp = iVar5;
    }
    if (uVar3 != 0) {
      zExp = iVar5;
    }
    fVar1 = roundAndPackFloat64((flag)uVar6,zExp,(ulong)((uint)a.low & 1) | uVar3 >> 1,status);
    return fVar1;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
    return uVar6 << 0x3f | 0x7ff0000000000000;
  }
  if ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) != (undefined1  [16])0x0) &&
     (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  uVar4 = uVar3 * 2;
  uVar6 = uVar6 << 0x3f;
  if (-1 < (long)uVar3) {
    uVar4 = 0x8000000000000000;
    uVar6 = 0x8000000000000000;
  }
  fVar1 = uVar4 >> 0xc | 0x7ff0000000000000 | uVar6;
  if (status->default_nan_mode != '\0') {
    fVar1 = 0x7ff8000000000000;
  }
  if (uVar4 < 0x1000) {
    fVar1 = 0x7ff8000000000000;
  }
  return fVar1;
}

Assistant:

float64 floatx80_to_float64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, zSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat64(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shift64RightJamming( aSig, 1, &zSig );
    if ( aExp || aSig ) aExp -= 0x3C01;
    return roundAndPackFloat64(aSign, aExp, zSig, status);

}